

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionObject.cpp
# Opt level: O2

void __thiscall
Js::JavascriptExceptionContext::StackFrame::StackFrame
          (StackFrame *this,JavascriptFunction *func,JavascriptStackWalker *walker,
          bool initArgumentTypes)

{
  uint32 uVar1;
  FunctionBody *ptr;
  PCWSTR ptr_00;
  
  (this->functionBody).ptr = (FunctionBody *)0x0;
  (this->argumentTypes).types = 0x2000000000000000;
  ptr = JavascriptFunction::GetFunctionBody(func);
  Memory::WriteBarrierPtr<Js::FunctionBody>::WriteBarrierSet(&this->functionBody,ptr);
  if ((this->functionBody).ptr == (FunctionBody *)0x0) {
    ptr_00 = JavascriptStackWalker::GetCurrentNativeLibraryEntryName(walker);
    Memory::WriteBarrierPtr<const_char16_t>::WriteBarrierSet(&(this->field_1).name,ptr_00);
  }
  else {
    uVar1 = JavascriptStackWalker::GetByteCodeOffset(walker);
    (this->field_1).byteCodeOffset = uVar1;
  }
  if (initArgumentTypes && (this->functionBody).ptr != (FunctionBody *)0x0) {
    StackTraceArguments::Init(&this->argumentTypes,walker);
    return;
  }
  return;
}

Assistant:

JavascriptExceptionContext::StackFrame::StackFrame(JavascriptFunction* func, const JavascriptStackWalker& walker, bool initArgumentTypes)
    {
        this->functionBody = func->GetFunctionBody();

        if (this->functionBody)
        {
            this->byteCodeOffset = walker.GetByteCodeOffset();
        }
        else
        {
            this->name = walker.GetCurrentNativeLibraryEntryName();
        }

        if (this->functionBody && initArgumentTypes)
        {
            this->argumentTypes.Init(walker);
        }
    }